

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O0

Vec_Ptr_t * Abc_MfsComputeDivisors(Mfs_Man_t *p,Abc_Obj_t *pNode,int nLevDivMax)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *p_02;
  Abc_Obj_t *p_03;
  int nTrueSupp;
  int nDivsPlus;
  int m;
  int f;
  int k;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vDivs;
  Vec_Ptr_t *vCone;
  int nLevDivMax_local;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  if (p->vDivs != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDivs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsDiv.c"
                  ,199,"Vec_Ptr_t *Abc_MfsComputeDivisors(Mfs_Man_t *, Abc_Obj_t *, int)");
  }
  Abc_NtkIncrementTravId(pNode->pNtk);
  p_00 = Abc_MfsWinMarkTfi(pNode);
  for (m = 0; iVar1 = Vec_PtrSize(p_00), m < iVar1; m = m + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,m);
    Abc_ObjIsCi(pAVar2);
  }
  Abc_NtkIncrementTravId(pNode->pNtk);
  Abc_MfsWinSweepLeafTfo_rec(pNode,nLevDivMax);
  for (m = 0; iVar1 = Abc_ObjFaninNum(pNode), m < iVar1; m = m + 1) {
    pAVar2 = Abc_ObjFanin(pNode,m);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  p_01 = Vec_PtrAlloc(p->pPars->nWinMax);
  for (m = 0; iVar1 = Vec_PtrSize(p_00), m < iVar1; m = m + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,m);
    iVar1 = Abc_NodeIsTravIdPrevious(pAVar2);
    if ((iVar1 != 0) && ((int)(*(uint *)&pAVar2->field_0x14 >> 0xc) <= nLevDivMax)) {
      Vec_PtrPush(p_01,pAVar2);
      iVar1 = Vec_PtrSize(p_01);
      if (p->pPars->nWinMax <= iVar1) break;
    }
  }
  Vec_PtrFree(p_00);
  iVar1 = Vec_PtrSize(p_01);
  if (iVar1 < p->pPars->nWinMax) {
    for (m = 0; iVar1 = Vec_PtrSize(p_01), m < iVar1; m = m + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_01,m);
      for (nDivsPlus = 0;
          (iVar1 = Abc_ObjFanoutNum(pAVar2), nDivsPlus < iVar1 &&
          ((p_02 = Abc_ObjFanout(pAVar2,nDivsPlus), p->pPars->nFanoutsMax == 0 ||
           (nDivsPlus <= p->pPars->nFanoutsMax)))); nDivsPlus = nDivsPlus + 1) {
        iVar1 = Abc_NodeIsTravIdPrevious(p_02);
        if ((iVar1 == 0) &&
           (((iVar1 = Abc_NodeIsTravIdCurrent(p_02), iVar1 == 0 &&
             (iVar1 = Abc_ObjIsNode(p_02), iVar1 != 0)) &&
            ((int)(*(uint *)&p_02->field_0x14 >> 0xc) <= nLevDivMax)))) {
          for (nTrueSupp = 0; iVar1 = Abc_ObjFaninNum(p_02), nTrueSupp < iVar1;
              nTrueSupp = nTrueSupp + 1) {
            p_03 = Abc_ObjFanin(p_02,nTrueSupp);
            iVar1 = Abc_NodeIsTravIdPrevious(p_03);
            if (iVar1 == 0) break;
          }
          iVar1 = Abc_ObjFaninNum(p_02);
          if (iVar1 <= nTrueSupp) {
            Vec_PtrPush(p_01,p_02);
            Vec_PtrPushUnique(p->vNodes,p_02);
            Abc_NodeSetTravIdPrevious(p_02);
            iVar1 = Vec_PtrSize(p_01);
            if (p->pPars->nWinMax <= iVar1) break;
          }
        }
      }
      iVar1 = Vec_PtrSize(p_01);
      if (p->pPars->nWinMax <= iVar1) break;
    }
  }
  iVar1 = Vec_PtrSize(p_01);
  p->nMaxDivs = (uint)(p->pPars->nWinMax <= iVar1) + p->nMaxDivs;
  Vec_PtrSort(p_01,Abc_NodeCompareLevelsIncrease);
  for (m = 0; iVar1 = Abc_ObjFaninNum(pNode), m < iVar1; m = m + 1) {
    pAVar2 = Abc_ObjFanin(pNode,m);
    Vec_PtrPush(p_01,pAVar2);
  }
  return p_01;
}

Assistant:

Vec_Ptr_t * Abc_MfsComputeDivisors( Mfs_Man_t * p, Abc_Obj_t * pNode, int nLevDivMax )
{
    Vec_Ptr_t * vCone, * vDivs;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int k, f, m;
    int nDivsPlus = 0, nTrueSupp;
    assert( p->vDivs == NULL );

    // mark the TFI with the current trav ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    vCone = Abc_MfsWinMarkTfi( pNode );

    // count the number of PIs
    nTrueSupp = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
        nTrueSupp += Abc_ObjIsCi(pObj);
//    printf( "%d(%d) ", Vec_PtrSize(p->vSupp), m );

    // mark with the current trav ID those nodes that should not be divisors:
    // (1) the node and its TFO
    // (2) the MFFC of the node
    // (3) the node's fanins (these are treated as a special case)
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_MfsWinSweepLeafTfo_rec( pNode, nLevDivMax );
//    Abc_MfsWinVisitMffc( pNode );
    Abc_ObjForEachFanin( pNode, pObj, k )
        Abc_NodeSetTravIdCurrent( pObj );

    // at this point the nodes are marked with two trav IDs:
    // nodes to be collected as divisors are marked with previous trav ID
    // nodes to be avoided as divisors are marked with current trav ID

    // start collecting the divisors
    vDivs = Vec_PtrAlloc( p->pPars->nWinMax );
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
    {
        if ( !Abc_NodeIsTravIdPrevious(pObj) )
            continue;
        if ( (int)pObj->Level > nLevDivMax )
            continue;
        Vec_PtrPush( vDivs, pObj );
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    Vec_PtrFree( vCone );

    // explore the fanouts of already collected divisors
    if ( Vec_PtrSize(vDivs) < p->pPars->nWinMax )
    Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pObj, k )
    {
        // consider fanouts of this node
        Abc_ObjForEachFanout( pObj, pFanout, f )
        {
            // stop if there are too many fanouts
            if ( p->pPars->nFanoutsMax && f > p->pPars->nFanoutsMax )
                break;
            // skip nodes that are already added
            if ( Abc_NodeIsTravIdPrevious(pFanout) )
                continue;
            // skip nodes in the TFO or in the MFFC of node
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // skip COs
            if ( !Abc_ObjIsNode(pFanout) ) 
                continue;
            // skip nodes with large level
            if ( (int)pFanout->Level > nLevDivMax )
                continue;
            // skip nodes whose fanins are not divisors  -- here we skip more than we need to skip!!! (revise later)  August 7, 2009
            Abc_ObjForEachFanin( pFanout, pFanin, m )
                if ( !Abc_NodeIsTravIdPrevious(pFanin) )
                    break;
            if ( m < Abc_ObjFaninNum(pFanout) )
                continue;
            // make sure this divisor in not among the nodes
//            Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pFanin, m )
//                assert( pFanout != pFanin );
            // add the node to the divisors
            Vec_PtrPush( vDivs, pFanout );
//            Vec_PtrPush( p->vNodes, pFanout );
            Vec_PtrPushUnique( p->vNodes, pFanout );
            Abc_NodeSetTravIdPrevious( pFanout );
            nDivsPlus++;
            if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
                break;
        }
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    p->nMaxDivs += (Vec_PtrSize(vDivs) >= p->pPars->nWinMax);

    // sort the divisors by level in the increasing order
    Vec_PtrSort( vDivs, (int (*)(void))Abc_NodeCompareLevelsIncrease );

    // add the fanins of the node
    Abc_ObjForEachFanin( pNode, pFanin, k )
        Vec_PtrPush( vDivs, pFanin );

/*
    printf( "Node level = %d.  ", Abc_ObjLevel(p->pNode) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDivs, pObj, k, Vec_PtrSize(vDivs)-p->nDivsPlus )
        printf( "%d ", Abc_ObjLevel(pObj) );
    printf( "\n" );
*/
//printf( "%d ", p->nDivsPlus );
//    printf( "(%d+%d)(%d+%d+%d) ", Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), 
//        nTrueSupp, Vec_PtrSize(vDivs)-nTrueSupp-nDivsPlus, nDivsPlus );
    return vDivs;
}